

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O3

void __thiscall TypeDeclarator::~TypeDeclarator(TypeDeclarator *this)

{
  pointer pcVar1;
  bool bVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  ulong uVar5;
  ulong uVar6;
  
  ppTVar3 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppTVar4 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppTVar4 != ppTVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (ppTVar3[uVar5] != (TypeModifier *)0x0) {
        (*ppTVar3[uVar5]->_vptr_TypeModifier[1])();
        ppTVar3 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar4 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      bVar2 = uVar6 < (ulong)((long)ppTVar4 - (long)ppTVar3 >> 3);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  pcVar1 = (this->model)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->model).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ident)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ident).field_2) {
    operator_delete(pcVar1);
  }
  ppTVar3 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppTVar3 != (pointer)0x0) {
    operator_delete(ppTVar3);
    return;
  }
  return;
}

Assistant:

TypeDeclarator::~TypeDeclarator(void)

{
  for(uint4 i=0;i<mods.size();++i)
    delete mods[i];
}